

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

xmlDocPtr parseHtml(xmllintState *lint,char *filename)

{
  xmlParserCtxtPtr pxVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  xmlParserInputPtr input;
  char chars [4096];
  FILE *pFStack_38;
  int res;
  FILE *f;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  char *filename_local;
  xmllintState *lint_local;
  
  pxVar1 = lint->ctxt;
  if (lint->push == 0) {
    if (lint->memory == 0) {
      iVar2 = strcmp(filename,"-");
      if (iVar2 == 0) {
        f = (FILE *)htmlCtxtReadFd(pxVar1,0,"-",0,lint->options);
      }
      else {
        f = (FILE *)htmlCtxtReadFile(pxVar1,filename,0,lint->options);
      }
      lint_local = (xmllintState *)f;
    }
    else {
      lVar4 = xmlNewInputFromMemory(filename,lint->memoryData,lint->memorySize,6);
      if (lVar4 == 0) {
        lint->progresult = XMLLINT_ERR_MEM;
        lint_local = (xmllintState *)0x0;
      }
      else {
        lint_local = (xmllintState *)htmlCtxtParseDocument(pxVar1,lVar4);
      }
    }
  }
  else {
    if ((*filename == '-') && (filename[1] == '\0')) {
      pFStack_38 = _stdin;
    }
    else {
      pFStack_38 = fopen64(filename,"rb");
      if (pFStack_38 == (FILE *)0x0) {
        fprintf((FILE *)lint->errStream,"Can\'t open %s\n",filename);
        lint->progresult = XMLLINT_ERR_RDFILE;
        return (xmlDocPtr)0x0;
      }
    }
    while (sVar3 = fread(&input,1,0x1000,pFStack_38), 0 < (int)sVar3) {
      htmlParseChunk(pxVar1,&input,sVar3 & 0xffffffff,0);
    }
    htmlParseChunk(pxVar1,&input,0,1);
    lint_local = (xmllintState *)pxVar1->myDoc;
    pxVar1->myDoc = (xmlDocPtr)0x0;
    if (pFStack_38 != _stdin) {
      fclose(pFStack_38);
    }
  }
  return (xmlDocPtr)lint_local;
}

Assistant:

static xmlDocPtr
parseHtml(xmllintState *lint, const char *filename) {
    xmlParserCtxtPtr ctxt = lint->ctxt;
    xmlDocPtr doc;

#ifdef LIBXML_PUSH_ENABLED
    if (lint->push) {
        FILE *f;
        int res;
        char chars[4096];

        if ((filename[0] == '-') && (filename[1] == 0)) {
            f = stdin;
        } else {
	    f = fopen(filename, "rb");
            if (f == NULL) {
                fprintf(lint->errStream, "Can't open %s\n", filename);
                lint->progresult = XMLLINT_ERR_RDFILE;
                return(NULL);
            }
        }

        while ((res = fread(chars, 1, 4096, f)) > 0) {
            htmlParseChunk(ctxt, chars, res, 0);
        }
        htmlParseChunk(ctxt, chars, 0, 1);
        doc = ctxt->myDoc;
        ctxt->myDoc = NULL;
        if (f != stdin)
            fclose(f);

        return(doc);
    }
#endif /* LIBXML_PUSH_ENABLED */

#if HAVE_DECL_MMAP
    if (lint->memory) {
        xmlParserInputPtr input;

        input = xmlNewInputFromMemory(filename,
                                      lint->memoryData, lint->memorySize,
                                      XML_INPUT_BUF_STATIC |
                                      XML_INPUT_BUF_ZERO_TERMINATED);
        if (input == NULL) {
            lint->progresult = XMLLINT_ERR_MEM;
            return(NULL);
        }
        doc = htmlCtxtParseDocument(ctxt, input);
        return(doc);
    }
#endif

    if (strcmp(filename, "-") == 0)
        doc = htmlCtxtReadFd(ctxt, STDIN_FILENO, "-", NULL,
                             lint->options);
    else
        doc = htmlCtxtReadFile(ctxt, filename, NULL, lint->options);

    return(doc);
}